

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void BrotliDecoderDestroyInstance(BrotliDecoderStateInternal *state)

{
  brotli_free_func UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if (state != (BrotliDecoderStateInternal *)0x0) {
    UNRECOVERED_JUMPTABLE = state->free_func;
    pvVar1 = state->memory_manager_opaque;
    BrotliDecoderStateCleanup(state);
    (*UNRECOVERED_JUMPTABLE)(pvVar1,state);
    return;
  }
  return;
}

Assistant:

void BrotliDecoderDestroyInstance(BrotliDecoderState* state) {
  if (!state) {
    return;
  } else {
    brotli_free_func free_func = state->free_func;
    void* opaque = state->memory_manager_opaque;
    BrotliDecoderStateCleanup(state);
    free_func(opaque, state);
  }
}